

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

NodeSet * __thiscall
capnp::compiler::NodeTranslator::finish(NodeSet *__return_storage_ptr__,NodeTranslator *this)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  undefined8 *puVar5;
  Reader source;
  Reader type;
  Builder target;
  UnfinishedValue *pUVar6;
  ulong uVar7;
  long lVar8;
  
  pUVar6 = (this->unfinishedValues).builder.ptr;
  if ((this->unfinishedValues).builder.pos != pUVar6) {
    lVar8 = 0x68;
    uVar7 = 0;
    do {
      puVar1 = (undefined8 *)((long)&(pUVar6->source)._reader.data + lVar8);
      puVar2 = (undefined8 *)((long)pUVar6 + lVar8 + -0x18);
      puVar3 = (undefined8 *)((long)pUVar6 + lVar8 + -0x28);
      puVar4 = (undefined8 *)((long)pUVar6 + lVar8 + -0x58);
      puVar5 = (undefined8 *)((long)pUVar6 + lVar8 + -0x48);
      source._reader.data = (void *)*puVar4;
      source._reader._0_16_ = *(undefined1 (*) [16])((long)pUVar6 + lVar8 + -0x68);
      source._reader.pointers = (WirePointer *)puVar4[1];
      source._reader._32_8_ = *puVar5;
      source._reader._40_8_ = puVar5[1];
      type._reader.data = (void *)*puVar3;
      type._reader._0_16_ = *(undefined1 (*) [16])((long)pUVar6 + lVar8 + -0x38);
      type._reader.pointers = (WirePointer *)puVar3[1];
      type._reader._32_8_ = *puVar2;
      type._reader._40_8_ = puVar2[1];
      target._builder.data = (void *)*puVar1;
      target._builder._0_16_ =
           *(undefined1 (*) [16])((long)&(pUVar6->source)._reader.segment + lVar8);
      target._builder.pointers = (WirePointer *)puVar1[1];
      target._builder._32_8_ = *(undefined8 *)((long)&(pUVar6->source)._reader.dataSize + lVar8);
      compileValue(this,source,type,*(RawBrandedSchema **)((long)pUVar6 + lVar8 + -8),target,false);
      uVar7 = uVar7 + 1;
      pUVar6 = (this->unfinishedValues).builder.ptr;
      lVar8 = lVar8 + 0x90;
    } while (uVar7 < (ulong)(((long)(this->unfinishedValues).builder.pos - (long)pUVar6 >> 4) *
                            -0x71c71c71c71c71c7));
  }
  getBootstrapNode(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

NodeTranslator::NodeSet NodeTranslator::finish() {
  // Careful about iteration here:  compileFinalValue() may actually add more elements to
  // `unfinishedValues`, invalidating iterators in the process.
  for (size_t i = 0; i < unfinishedValues.size(); i++) {
    auto& value = unfinishedValues[i];
    compileValue(value.source, value.type, value.typeScope, value.target, false);
  }

  return getBootstrapNode();
}